

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v10::detail::
         do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>
                   (appender out,decimal_fp<float> *f,format_specs<char> *specs,float_specs fspecs,
                   locale_ref loc)

{
  float_specs fVar1;
  bool bVar2;
  type tVar3;
  int iVar4;
  appender *paVar5;
  appender it;
  bool local_291;
  int local_278;
  int local_274;
  undefined1 local_259;
  int local_258;
  char local_251;
  anon_class_56_7_162c6e41 local_250;
  float_specs local_218;
  bool local_20d;
  int local_20c;
  undefined1 auStack_208 [3];
  bool pointy;
  int num_zeros;
  significand_type *local_200;
  int *local_1f8;
  int *local_1f0;
  char *local_1e8;
  digit_grouping<char> *local_1e0;
  int *local_1d8;
  char *local_1d0;
  float_specs local_1c8;
  decimal_fp<float> *local_1c0;
  undefined1 local_1b8 [8];
  digit_grouping<char> grouping_1;
  undefined1 auStack_170 [4];
  int num_zeros_3;
  significand_type *local_168;
  int *local_160;
  format_specs<char> *local_158;
  digit_grouping<char> *local_150;
  locale_ref *local_148;
  char *local_140;
  int *local_138;
  char *local_130;
  float_specs local_128;
  decimal_fp<float> *local_110;
  undefined1 local_108 [8];
  digit_grouping<char> grouping;
  int num_zeros_2;
  int exp;
  undefined1 local_9c [8];
  anon_class_28_8_ad0ecca5 write;
  char exp_char;
  int exp_digits;
  int abs_output_exp;
  int num_zeros_1;
  anon_class_12_2_f0c9b3c6 use_exp_format;
  int output_exp;
  char local_51;
  size_t sStack_50;
  char decimal_point;
  size_t size;
  int local_40;
  sign_t sign;
  significand_type sStack_3c;
  char zero;
  int significand_size;
  significand_type significand;
  format_specs<char> *specs_local;
  decimal_fp<float> *f_local;
  locale_ref loc_local;
  float_specs fspecs_local;
  appender out_local;
  
  sStack_3c = f->significand;
  _significand_size = specs;
  specs_local = (format_specs<char> *)f;
  f_local = (decimal_fp<float> *)loc.locale_;
  loc_local.locale_ = (void *)fspecs;
  fspecs_local = (float_specs)
                 out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  local_40 = get_significand_size<float>(f);
  size._7_1_ = 0x30;
  size._6_1_ = (sign_t)((ulong)loc_local.locale_ >> 0x28);
  tVar3 = to_unsigned<int>(local_40);
  sStack_50 = (size_t)(tVar3 + (size._6_1_ != none));
  if ((loc_local.locale_._4_4_ >> 0x11 & 1) == 0) {
    local_251 = '.';
  }
  else {
    stack0xffffffffffffffa0 = f_local;
    local_251 = decimal_point<char>((locale_ref)f_local);
  }
  local_51 = local_251;
  use_exp_format.fspecs.precision = specs_local->precision + local_40 + -1;
  _abs_output_exp = (float_specs)loc_local.locale_;
  use_exp_format.fspecs._4_4_ = use_exp_format.fspecs.precision;
  bVar2 = do_write_float<fmt::v10::appender,_fmt::v10::detail::dragonbox::decimal_fp<float>,_char,_fmt::v10::detail::digit_grouping<char>_>
          ::anon_class_12_2_f0c9b3c6::operator()((anon_class_12_2_f0c9b3c6 *)&abs_output_exp);
  if (bVar2) {
    exp_digits = 0;
    if ((loc_local.locale_._4_4_ >> 0x13 & 1) == 0) {
      if (local_40 == 1) {
        local_51 = '\0';
      }
    }
    else {
      exp_digits = (int)loc_local.locale_ - local_40;
      if (exp_digits < 0) {
        exp_digits = 0;
      }
      tVar3 = to_unsigned<int>(exp_digits);
      sStack_50 = tVar3 + sStack_50;
    }
    if ((int)use_exp_format.fspecs._4_4_ < 0) {
      local_258 = -use_exp_format.fspecs._4_4_;
    }
    else {
      local_258 = use_exp_format.fspecs._4_4_;
    }
    write.output_exp = 2;
    if ((99 < local_258) && (write.output_exp = 3, 999 < local_258)) {
      write.output_exp = 4;
    }
    tVar3 = to_unsigned<int>((local_51 != '\0') + 2 + write.output_exp);
    fVar1 = fspecs_local;
    sStack_50 = tVar3 + sStack_50;
    local_259 = 0x45;
    if (((ulong)loc_local.locale_ & 0x1000000000000) == 0) {
      local_259 = 0x65;
    }
    write._23_1_ = local_259;
    local_9c[0] = size._6_1_;
    local_9c._4_4_ = sStack_3c;
    write._0_4_ = local_40;
    write.significand._0_1_ = local_51;
    write.significand_size = exp_digits;
    write.decimal_point = '0';
    write._13_1_ = local_259;
    write.num_zeros = use_exp_format.fspecs._4_4_;
    if (_significand_size->width < 1) {
      paVar5 = reserve<fmt::v10::appender>((appender *)&fspecs_local,sStack_50);
      it = do_write_float<fmt::v10::appender,_fmt::v10::detail::dragonbox::decimal_fp<float>,_char,_fmt::v10::detail::digit_grouping<char>_>
           ::anon_class_28_8_ad0ecca5::operator()
                     ((anon_class_28_8_ad0ecca5 *)local_9c,
                      (iterator)
                      (paVar5->super_back_insert_iterator<fmt::v10::detail::buffer<char>_>).
                      container);
      out_local = base_iterator<fmt::v10::appender>((appender)fVar1,it);
    }
    else {
      out_local = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_1_&>
                            ((appender)fspecs_local,_significand_size,sStack_50,
                             (anon_class_28_8_ad0ecca5 *)local_9c);
    }
  }
  else {
    grouping._60_4_ = specs_local->precision + local_40;
    if (specs_local->precision < 0) {
      if ((int)grouping._60_4_ < 1) {
        local_20c = -grouping._60_4_;
        if (((local_40 == 0) && (-1 < (int)loc_local.locale_)) &&
           ((int)loc_local.locale_ < local_20c)) {
          local_20c = (int)loc_local.locale_;
        }
        local_291 = true;
        if ((local_20c == 0) && (local_291 = true, local_40 == 0)) {
          local_291 = (bool)((byte)(loc_local.locale_._4_4_ >> 0x13) & 1);
        }
        local_20d = local_291;
        tVar3 = to_unsigned<int>(local_20c);
        sStack_50 = ((local_291 != false) + 1 + tVar3) + sStack_50;
        local_218 = fspecs_local;
        local_250.sign = (sign_t *)((long)&size + 6);
        local_250.zero = (char *)((long)&size + 7);
        local_250.pointy = &local_20d;
        local_250.decimal_point = &local_51;
        local_250.num_zeros = &local_20c;
        local_250.significand = &stack0xffffffffffffffc4;
        local_250.significand_size = &local_40;
        out_local = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_4_>
                              ((appender)fspecs_local,_significand_size,sStack_50,&local_250);
      }
      else {
        if ((loc_local.locale_._4_4_ >> 0x13 & 1) == 0) {
          local_274 = 0;
        }
        else {
          local_274 = (int)loc_local.locale_ - local_40;
        }
        grouping_1._60_4_ = local_274;
        if (local_274 < 1) {
          local_278 = 0;
        }
        else {
          local_278 = local_274;
        }
        tVar3 = to_unsigned<int>(local_278);
        sStack_50 = sStack_50 + (tVar3 + 1);
        local_1c0 = f_local;
        digit_grouping<char>::digit_grouping
                  ((digit_grouping<char> *)local_1b8,(locale_ref)f_local,
                   (bool)((byte)(loc_local.locale_._4_4_ >> 0x11) & 1));
        iVar4 = digit_grouping<char>::count_separators
                          ((digit_grouping<char> *)local_1b8,grouping._60_4_);
        tVar3 = to_unsigned<int>(iVar4);
        sStack_50 = sStack_50 + tVar3;
        local_1c8 = fspecs_local;
        _auStack_208 = (sign_t *)((long)&size + 6);
        local_200 = &stack0xffffffffffffffc4;
        local_1f8 = &local_40;
        local_1f0 = (int *)&grouping.field_0x3c;
        local_1e8 = &local_51;
        local_1e0 = (digit_grouping<char> *)local_1b8;
        local_1d8 = (int *)&grouping_1.field_0x3c;
        local_1d0 = (char *)((long)&size + 7);
        out_local = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_3_>
                              ((appender)fspecs_local,_significand_size,sStack_50,
                               (anon_class_64_8_e6ffa566 *)auStack_208);
        digit_grouping<char>::~digit_grouping((digit_grouping<char> *)local_1b8);
      }
    }
    else {
      tVar3 = to_unsigned<int>(specs_local->precision);
      sStack_50 = tVar3 + sStack_50;
      grouping._56_4_ = (int)loc_local.locale_ - grouping._60_4_;
      abort_fuzzing_if(5000 < (int)grouping._56_4_);
      if ((loc_local.locale_._4_4_ >> 0x13 & 1) != 0) {
        sStack_50 = sStack_50 + 1;
        if (((int)grouping._56_4_ < 1) && ((char)((ulong)loc_local.locale_ >> 0x20) != '\x02')) {
          grouping._56_4_ = 0;
        }
        if (0 < (int)grouping._56_4_) {
          tVar3 = to_unsigned<int>(grouping._56_4_);
          sStack_50 = tVar3 + sStack_50;
        }
      }
      local_110 = f_local;
      digit_grouping<char>::digit_grouping
                ((digit_grouping<char> *)local_108,(locale_ref)f_local,
                 (bool)((byte)(loc_local.locale_._4_4_ >> 0x11) & 1));
      iVar4 = digit_grouping<char>::count_separators
                        ((digit_grouping<char> *)local_108,grouping._60_4_);
      tVar3 = to_unsigned<int>(iVar4);
      sStack_50 = sStack_50 + tVar3;
      local_128 = fspecs_local;
      _auStack_170 = (sign_t *)((long)&size + 6);
      local_168 = &stack0xffffffffffffffc4;
      local_160 = &local_40;
      local_158 = specs_local;
      local_150 = (digit_grouping<char> *)local_108;
      local_148 = &loc_local;
      local_140 = &local_51;
      local_138 = (int *)&grouping.field_0x38;
      local_130 = (char *)((long)&size + 7);
      out_local = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_2_>
                            ((appender)fspecs_local,_significand_size,sStack_50,
                             (anon_class_72_9_0c6a3a8a *)auStack_170);
      digit_grouping<char>::~digit_grouping((digit_grouping<char> *)local_108);
    }
  }
  return (appender)
         out_local.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = fspecs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (fspecs.showpoint) {
      ++size;
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}